

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O1

QRect __thiscall QListModeViewBase::mapToViewport(QListModeViewBase *this,QRect *rect)

{
  uint uVar1;
  int iVar2;
  QListViewPrivate *pQVar3;
  QWidgetData *pQVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  QRect QVar11;
  
  pQVar3 = (this->super_QCommonListViewBase).dd;
  uVar5._0_4_ = rect->x1;
  uVar5._4_4_ = rect->y1;
  if (pQVar3->wrap == true) {
    uVar6 = uVar5 >> 0x20;
    uVar8._0_4_ = rect->x2;
    uVar8._4_4_ = rect->y2;
  }
  else {
    uVar7._0_4_ = rect->x2;
    uVar7._4_4_ = rect->y2;
    if (pQVar3->flow == TopToBottom) {
      uVar6 = uVar5 >> 0x20;
      uVar1 = pQVar3->space;
      uVar5 = (ulong)uVar1;
      iVar10 = ((rect->x2).m_i - (rect->x1).m_i) + 1;
      iVar2 = (this->super_QCommonListViewBase).contentsSize.wd.m_i;
      pQVar4 = ((pQVar3->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)
               ->data;
      iVar9 = ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i) + 1;
      if (iVar9 < iVar2) {
        iVar9 = iVar2;
      }
      iVar9 = iVar9 + uVar1 * -2;
      if (iVar9 < iVar10) {
        iVar9 = iVar10;
      }
      uVar8 = (ulong)((uVar1 + iVar9) - 1);
      uVar7 = uVar7 & 0xffffffff00000000;
    }
    else {
      uVar1 = pQVar3->space;
      uVar6 = (ulong)uVar1;
      iVar10 = ((rect->y2).m_i - (rect->y1).m_i) + 1;
      iVar2 = (this->super_QCommonListViewBase).contentsSize.ht.m_i;
      pQVar4 = ((pQVar3->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)
               ->data;
      iVar9 = ((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i) + 1;
      if (iVar9 < iVar2) {
        iVar9 = iVar2;
      }
      iVar9 = iVar9 + uVar1 * -2;
      if (iVar9 < iVar10) {
        iVar9 = iVar10;
      }
      uVar8 = (ulong)((uVar1 + iVar9) - 1) << 0x20;
      uVar7 = uVar7 & 0xffffffff;
    }
    uVar8 = uVar7 | uVar8;
  }
  QVar11._0_8_ = uVar5 & 0xffffffff | uVar6 << 0x20;
  QVar11.x2.m_i = (int)uVar8;
  QVar11.y2.m_i = (int)(uVar8 >> 0x20);
  return QVar11;
}

Assistant:

inline bool QCommonListViewBase::isWrapping() const { return dd->isWrapping(); }